

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any_lite.cc
# Opt level: O2

bool __thiscall
google::protobuf::internal::ParseAnyTypeUrl
          (internal *this,string_view type_url,string *url_prefix,string *full_type_name)

{
  bool bVar1;
  size_type sVar2;
  size_type __n;
  allocator<char> local_61;
  string_view type_url_local;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  string local_40 [32];
  
  type_url_local._M_str = (char *)type_url._M_len;
  type_url_local._M_len = (size_t)this;
  sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::rfind
                    (&type_url_local,'/',0xffffffffffffffff);
  if ((sVar2 == 0xffffffffffffffff) || (__n = sVar2 + 1, __n == type_url_local._M_len)) {
    bVar1 = false;
  }
  else {
    if ((string *)type_url._M_str != (string *)0x0) {
      local_50 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                           (&type_url_local,0,__n);
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                (local_40,&local_50,&local_61);
      std::__cxx11::string::operator=((string *)type_url._M_str,local_40);
      std::__cxx11::string::~string(local_40);
    }
    local_50 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                         (&type_url_local,__n,0xffffffffffffffff);
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              (local_40,&local_50,&local_61);
    std::__cxx11::string::operator=((string *)url_prefix,local_40);
    std::__cxx11::string::~string(local_40);
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool ParseAnyTypeUrl(absl::string_view type_url,
                     std::string* PROTOBUF_NULLABLE url_prefix,
                     std::string* PROTOBUF_NONNULL full_type_name) {
  size_t pos = type_url.find_last_of('/');
  if (pos == std::string::npos || pos + 1 == type_url.size()) {
    return false;
  }
  if (url_prefix) {
    *url_prefix = std::string(type_url.substr(0, pos + 1));
  }
  *full_type_name = std::string(type_url.substr(pos + 1));
  return true;
}